

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

RPCHelpMan * getchainstates(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  RPCExamples examples;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  RPCHelpMan *in_RDI;
  undefined8 uVar5;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffaa8;
  code *pcVar6;
  undefined8 in_stack_fffffffffffffab0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffab8;
  _Vector_impl_data in_stack_fffffffffffffac8;
  _Vector_impl_data in_stack_fffffffffffffae0;
  pointer pRVar7;
  pointer pRVar8;
  pointer pRVar9;
  undefined8 in_stack_fffffffffffffb10;
  vector<RPCResult,_std::allocator<RPCResult>_> local_4e8;
  RPCResults local_4d0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  ulong *local_3d8;
  undefined8 local_3d0;
  ulong local_3c8;
  undefined8 uStack_3c0;
  ulong *local_3b8;
  size_type local_3b0;
  ulong local_3a8;
  undefined8 uStack_3a0;
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  RPCResult local_358;
  long *local_2d0 [2];
  long local_2c0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b0;
  long *local_290 [2];
  long local_280 [2];
  pointer local_270 [2];
  undefined1 local_260 [152];
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getchainstates","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nReturn information about chainstates.\n","");
  local_120[0] = local_110;
  local_4b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_270[0] = (pointer)local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"headers","");
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,"the number of headers seen so far","");
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffaa0;
  description._M_string_length = in_stack_fffffffffffffab0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaa8;
  description.field_2 = in_stack_fffffffffffffab8;
  RPCResult::RPCResult
            ((RPCResult *)(local_260 + 0x10),NUM,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffac8,
             SUB81(local_270,0));
  local_2b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_2b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"chainstates","");
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,
             "list of the chainstates ordered by work, with the most-work (active) chainstate last",
             "");
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"");
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"");
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffac8,
             &RPCHelpForChainstate);
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffffaa0;
  description_00._M_string_length = in_stack_fffffffffffffab0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaa8;
  description_00.field_2 = in_stack_fffffffffffffab8;
  RPCResult::RPCResult
            (&local_358,OBJ,m_key_name_00,description_00,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffac8,
             SUB81(local_378,0));
  __l._M_len = 1;
  __l._M_array = &local_358;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffae0,__l,
             (allocator_type *)&stack0xfffffffffffffac7);
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffffaa0;
  description_01._M_string_length = in_stack_fffffffffffffab0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaa8;
  description_01.field_2._M_local_buf = in_stack_fffffffffffffab8._M_local_buf;
  RPCResult::RPCResult
            (&local_1c8,ARR,m_key_name_01,description_01,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffac8,
             SUB81(&local_2b0,0));
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)(local_260 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_4e8,__l_00,(allocator_type *)&stack0xfffffffffffffac6);
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffffaa0;
  description_02._M_string_length = in_stack_fffffffffffffab0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaa8;
  description_02.field_2 = in_stack_fffffffffffffab8;
  RPCResult::RPCResult
            (&local_100,OBJ,m_key_name_02,description_02,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffac8,
             SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffffa88;
  result.m_key_name._M_string_length = in_stack_fffffffffffffa98;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffaa0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffaa8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffab0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffab8;
  result._64_24_ = in_stack_fffffffffffffac8;
  result._88_24_ = in_stack_fffffffffffffae0;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar8;
  result.m_cond.field_2._8_8_ = pRVar9;
  RPCResults::RPCResults(&local_4d0,result);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"getchainstates","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"");
  HelpExampleCli(&local_3f8,&local_418,&local_438);
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"getchainstates","");
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
  HelpExampleRpc(&local_458,&local_478,&local_498);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    uVar5 = local_3f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_458._M_string_length + local_3f8._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      uVar5 = local_458.field_2._M_allocated_capacity;
    }
    if (local_458._M_string_length + local_3f8._M_string_length <= (ulong)uVar5) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_458,0,0,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
      goto LAB_002c1217;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_3f8,local_458._M_dataplus._M_p,local_458._M_string_length);
LAB_002c1217:
  local_3d8 = &local_3c8;
  puVar2 = (ulong *)(pbVar3->_M_dataplus)._M_p;
  paVar1 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_3c8 = paVar1->_M_allocated_capacity;
    uStack_3c0 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_3c8 = paVar1->_M_allocated_capacity;
    local_3d8 = puVar2;
  }
  local_3b0 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar3->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_3d8 == &local_3c8) {
    uStack_3a0 = uStack_3c0;
    local_3b8 = &local_3a8;
  }
  else {
    local_3b8 = local_3d8;
  }
  local_3a8 = local_3c8;
  local_3d0 = 0;
  local_3c8 = local_3c8 & 0xffffffffffffff00;
  pcVar6 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:3100:9)>
           ::_M_manager;
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:3100:9)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:3100:9)>
                ::_M_manager;
  description_03.field_2 = in_stack_fffffffffffffab8;
  examples.m_examples._M_string_length = (size_type)pRVar8;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar9;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffb10;
  local_3d8 = &local_3c8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffffa98)),description_03,
             (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffffac8,
             (RPCResults)in_stack_fffffffffffffae0,examples,(RPCMethodImpl *)&local_58);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffa98,&stack0xfffffffffffffa98,3);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,local_3c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_4d0.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_4e8);
  lVar4 = 0x110;
  do {
    if ((long *)(local_260 + lVar4) != *(long **)((long)local_270 + lVar4)) {
      operator_delete(*(long **)((long)local_270 + lVar4),*(long *)(local_260 + lVar4) + 1);
    }
    if ((long *)((long)local_280 + lVar4) != *(long **)((long)local_290 + lVar4)) {
      operator_delete(*(long **)((long)local_290 + lVar4),*(long *)((long)local_280 + lVar4) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_2b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar4));
    if ((long *)((long)local_2c0 + lVar4) != *(long **)((long)local_2d0 + lVar4)) {
      operator_delete(*(long **)((long)local_2d0 + lVar4),*(long *)((long)local_2c0 + lVar4) + 1);
    }
    lVar4 = lVar4 + -0x88;
  } while (lVar4 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffae0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.m_cond._M_dataplus._M_p != &local_358.m_cond.field_2) {
    operator_delete(local_358.m_cond._M_dataplus._M_p,
                    local_358.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.m_description._M_dataplus._M_p != &local_358.m_description.field_2) {
    operator_delete(local_358.m_description._M_dataplus._M_p,
                    local_358.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_358.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.m_key_name._M_dataplus._M_p != &local_358.m_key_name.field_2) {
    operator_delete(local_358.m_key_name._M_dataplus._M_p,
                    local_358.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffac8);
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  if (local_2b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_2b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_2b0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffaf8);
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  if (local_270[0] != (pointer)local_260) {
    operator_delete(local_270[0],local_260._0_8_ + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_4b8);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getchainstates()
{
return RPCHelpMan{
        "getchainstates",
        "\nReturn information about chainstates.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::NUM, "headers", "the number of headers seen so far"},
                {RPCResult::Type::ARR, "chainstates", "list of the chainstates ordered by work, with the most-work (active) chainstate last", {{RPCResult::Type::OBJ, "", "", RPCHelpForChainstate},}},
            }
        },
        RPCExamples{
            HelpExampleCli("getchainstates", "")
    + HelpExampleRpc("getchainstates", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    LOCK(cs_main);
    UniValue obj(UniValue::VOBJ);

    ChainstateManager& chainman = EnsureAnyChainman(request.context);

    auto make_chain_data = [&](const Chainstate& cs, bool validated) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        AssertLockHeld(::cs_main);
        UniValue data(UniValue::VOBJ);
        if (!cs.m_chain.Tip()) {
            return data;
        }
        const CChain& chain = cs.m_chain;
        const CBlockIndex* tip = chain.Tip();

        data.pushKV("blocks",                (int)chain.Height());
        data.pushKV("bestblockhash",         tip->GetBlockHash().GetHex());
        data.pushKV("difficulty", GetDifficulty(*tip));
        data.pushKV("verificationprogress",  GuessVerificationProgress(Params().TxData(), tip));
        data.pushKV("coins_db_cache_bytes",  cs.m_coinsdb_cache_size_bytes);
        data.pushKV("coins_tip_cache_bytes", cs.m_coinstip_cache_size_bytes);
        if (cs.m_from_snapshot_blockhash) {
            data.pushKV("snapshot_blockhash", cs.m_from_snapshot_blockhash->ToString());
        }
        data.pushKV("validated", validated);
        return data;
    };

    obj.pushKV("headers", chainman.m_best_header ? chainman.m_best_header->nHeight : -1);

    const auto& chainstates = chainman.GetAll();
    UniValue obj_chainstates{UniValue::VARR};
    for (Chainstate* cs : chainstates) {
      obj_chainstates.push_back(make_chain_data(*cs, !cs->m_from_snapshot_blockhash || chainstates.size() == 1));
    }
    obj.pushKV("chainstates", std::move(obj_chainstates));
    return obj;
}